

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdType.cpp
# Opt level: O0

void __thiscall Id::Id(Id *this,string *name,TYPE type)

{
  TYPE type_local;
  string *name_local;
  Id *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->type = type;
  return;
}

Assistant:

Id::Id(std::string name, TYPE type) {
    this->name = std::move(name);
    this->type = type;
}